

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion.h
# Opt level: O0

quaternion * __thiscall irr::core::quaternion::operator=(quaternion *this,matrix4 *m)

{
  float *pfVar1;
  quaternion *pqVar2;
  CMatrix4<float> *in_RSI;
  float *in_RDI;
  float fVar3;
  float fVar4;
  f32 scale_3;
  f32 scale_2;
  f32 scale_1;
  f32 scale;
  f32 diag;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  
  pfVar1 = CMatrix4<float>::operator[](in_RSI,0);
  fVar3 = *pfVar1;
  pfVar1 = CMatrix4<float>::operator[](in_RSI,5);
  fVar4 = *pfVar1;
  pfVar1 = CMatrix4<float>::operator[](in_RSI,10);
  fVar3 = fVar3 + fVar4 + *pfVar1 + 1.0;
  if (0.0 < fVar3) {
    fVar4 = sqrtf(fVar3);
    fVar4 = fVar4 * 2.0;
    pfVar1 = CMatrix4<float>::operator[](in_RSI,6);
    fVar3 = *pfVar1;
    pfVar1 = CMatrix4<float>::operator[](in_RSI,9);
    *in_RDI = (fVar3 - *pfVar1) / fVar4;
    pfVar1 = CMatrix4<float>::operator[](in_RSI,8);
    fVar3 = *pfVar1;
    pfVar1 = CMatrix4<float>::operator[](in_RSI,2);
    in_RDI[1] = (fVar3 - *pfVar1) / fVar4;
    pfVar1 = CMatrix4<float>::operator[](in_RSI,1);
    fVar3 = *pfVar1;
    pfVar1 = CMatrix4<float>::operator[](in_RSI,4);
    in_RDI[2] = (fVar3 - *pfVar1) / fVar4;
    in_RDI[3] = fVar4 * 0.25;
  }
  else {
    pfVar1 = CMatrix4<float>::operator[](in_RSI,0);
    fVar3 = *pfVar1;
    pfVar1 = CMatrix4<float>::operator[](in_RSI,5);
    if (*pfVar1 <= fVar3 && fVar3 != *pfVar1) {
      pfVar1 = CMatrix4<float>::operator[](in_RSI,0);
      fVar3 = *pfVar1;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,10);
      if (*pfVar1 <= fVar3 && fVar3 != *pfVar1) {
        pfVar1 = CMatrix4<float>::operator[](in_RSI,0);
        fVar3 = *pfVar1;
        pfVar1 = CMatrix4<float>::operator[](in_RSI,5);
        fVar4 = *pfVar1;
        pfVar1 = CMatrix4<float>::operator[](in_RSI,10);
        fVar4 = sqrtf(((fVar3 + 1.0) - fVar4) - *pfVar1);
        fVar4 = fVar4 * 2.0;
        *in_RDI = fVar4 * 0.25;
        pfVar1 = CMatrix4<float>::operator[](in_RSI,4);
        fVar3 = *pfVar1;
        pfVar1 = CMatrix4<float>::operator[](in_RSI,1);
        in_RDI[1] = (fVar3 + *pfVar1) / fVar4;
        pfVar1 = CMatrix4<float>::operator[](in_RSI,2);
        fVar3 = *pfVar1;
        pfVar1 = CMatrix4<float>::operator[](in_RSI,8);
        in_RDI[2] = (fVar3 + *pfVar1) / fVar4;
        pfVar1 = CMatrix4<float>::operator[](in_RSI,6);
        fVar3 = *pfVar1;
        pfVar1 = CMatrix4<float>::operator[](in_RSI,9);
        in_RDI[3] = (fVar3 - *pfVar1) / fVar4;
        goto LAB_002eab4b;
      }
    }
    pfVar1 = CMatrix4<float>::operator[](in_RSI,5);
    fVar3 = *pfVar1;
    pfVar1 = CMatrix4<float>::operator[](in_RSI,10);
    if (fVar3 < *pfVar1 || fVar3 == *pfVar1) {
      pfVar1 = CMatrix4<float>::operator[](in_RSI,10);
      in_stack_ffffffffffffff74 = *pfVar1 + 1.0;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,0);
      fVar3 = in_stack_ffffffffffffff74 - *pfVar1;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,5);
      fVar4 = sqrtf(fVar3 - *pfVar1);
      fVar4 = fVar4 * 2.0;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,8);
      fVar3 = *pfVar1;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,2);
      *in_RDI = (fVar3 + *pfVar1) / fVar4;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,9);
      fVar3 = *pfVar1;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,6);
      in_RDI[1] = (fVar3 + *pfVar1) / fVar4;
      in_RDI[2] = fVar4 * 0.25;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,1);
      fVar3 = *pfVar1;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,4);
      in_RDI[3] = (fVar3 - *pfVar1) / fVar4;
    }
    else {
      pfVar1 = CMatrix4<float>::operator[](in_RSI,5);
      fVar3 = *pfVar1;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,0);
      fVar4 = *pfVar1;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,10);
      fVar4 = sqrtf(((fVar3 + 1.0) - fVar4) - *pfVar1);
      fVar4 = fVar4 * 2.0;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,4);
      fVar3 = *pfVar1;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,1);
      *in_RDI = (fVar3 + *pfVar1) / fVar4;
      in_RDI[1] = fVar4 * 0.25;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,9);
      fVar3 = *pfVar1;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,6);
      in_RDI[2] = (fVar3 + *pfVar1) / fVar4;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,8);
      fVar3 = *pfVar1;
      pfVar1 = CMatrix4<float>::operator[](in_RSI,2);
      in_RDI[3] = (fVar3 - *pfVar1) / fVar4;
    }
  }
LAB_002eab4b:
  pqVar2 = normalize((quaternion *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  return pqVar2;
}

Assistant:

inline quaternion &quaternion::operator=(const matrix4 &m)
{
	const f32 diag = m[0] + m[5] + m[10] + 1;

	if (diag > 0.0f) {
		const f32 scale = sqrtf(diag) * 2.0f; // get scale from diagonal

		// TODO: speed this up
		X = (m[6] - m[9]) / scale;
		Y = (m[8] - m[2]) / scale;
		Z = (m[1] - m[4]) / scale;
		W = 0.25f * scale;
	} else {
		if (m[0] > m[5] && m[0] > m[10]) {
			// 1st element of diag is greatest value
			// find scale according to 1st element, and double it
			const f32 scale = sqrtf(1.0f + m[0] - m[5] - m[10]) * 2.0f;

			// TODO: speed this up
			X = 0.25f * scale;
			Y = (m[4] + m[1]) / scale;
			Z = (m[2] + m[8]) / scale;
			W = (m[6] - m[9]) / scale;
		} else if (m[5] > m[10]) {
			// 2nd element of diag is greatest value
			// find scale according to 2nd element, and double it
			const f32 scale = sqrtf(1.0f + m[5] - m[0] - m[10]) * 2.0f;

			// TODO: speed this up
			X = (m[4] + m[1]) / scale;
			Y = 0.25f * scale;
			Z = (m[9] + m[6]) / scale;
			W = (m[8] - m[2]) / scale;
		} else {
			// 3rd element of diag is greatest value
			// find scale according to 3rd element, and double it
			const f32 scale = sqrtf(1.0f + m[10] - m[0] - m[5]) * 2.0f;

			// TODO: speed this up
			X = (m[8] + m[2]) / scale;
			Y = (m[9] + m[6]) / scale;
			Z = 0.25f * scale;
			W = (m[1] - m[4]) / scale;
		}
	}

	return normalize();
}